

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_to_half_pass.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::ConvertToHalfPass::ProcessImageRef(ConvertToHalfPass *this,Instruction *inst)

{
  size_type sVar1;
  size_type sVar2;
  DefUseManager *this_00;
  bool bVar3;
  initializer_list<unsigned_int> init_list;
  uint32_t dref_id;
  uint32_t local_4c;
  SmallVector<unsigned_int,_2UL> local_48;
  
  local_48._vptr_SmallVector._0_4_ = inst->opcode_;
  sVar1 = std::
          _Hashtable<spv::Op,_spv::Op,_std::allocator<spv::Op>,_std::__detail::_Identity,_std::equal_to<spv::Op>,_spvtools::opt::ConvertToHalfPass::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::count(&(this->dref_image_ops_)._M_h,(key_type *)&local_48);
  if (sVar1 == 0) {
    bVar3 = false;
  }
  else {
    dref_id = Instruction::GetSingleWordInOperand(inst,2);
    sVar2 = std::
            _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::count(&(this->converted_ids_)._M_h,&dref_id);
    bVar3 = sVar2 != 0;
    if (bVar3) {
      GenConvert(this,&dref_id,0x20,inst);
      local_4c = dref_id;
      init_list._M_len = 1;
      init_list._M_array = &local_4c;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_48,init_list);
      Instruction::SetInOperand(inst,2,&local_48);
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_48);
      this_00 = Pass::get_def_use_mgr(&this->super_Pass);
      analysis::DefUseManager::AnalyzeInstUse(this_00,inst);
    }
  }
  return bVar3;
}

Assistant:

bool ConvertToHalfPass::ProcessImageRef(Instruction* inst) {
  bool modified = false;
  // If image reference, only need to convert dref args back to float32
  if (dref_image_ops_.count(inst->opcode()) != 0) {
    uint32_t dref_id = inst->GetSingleWordInOperand(kImageSampleDrefIdInIdx);
    if (converted_ids_.count(dref_id) > 0) {
      GenConvert(&dref_id, 32, inst);
      inst->SetInOperand(kImageSampleDrefIdInIdx, {dref_id});
      get_def_use_mgr()->AnalyzeInstUse(inst);
      modified = true;
    }
  }
  return modified;
}